

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManAreDeriveNexts(Gia_ManAre_t *p,Gia_PtrAre_t Sta)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iLit1;
  uint uVar2;
  abctime aVar3;
  Gia_StaAre_t *pS;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  abctime aVar6;
  bool bVar7;
  abctime clk;
  int RetValue;
  int i;
  Gia_Obj_t *pObj;
  Gia_StaAre_t *pSta;
  Gia_ManAre_t *p_local;
  Gia_PtrAre_t Sta_local;
  
  aVar3 = Abc_Clock();
  pS = Gia_ManAreSta(p,Sta);
  iVar1 = Gia_StaIsUnused(pS);
  if (iVar1 == 0) {
    if ((p->pNew != (Gia_Man_t *)0x0) && (iVar1 = Gia_ManObjNum(p->pNew), 1000000 < iVar1)) {
      Gia_ManStop(p->pNew);
      p->pNew = (Gia_Man_t *)0x0;
    }
    if (p->pNew == (Gia_Man_t *)0x0) {
      iVar1 = Gia_ManObjNum(p->pAig);
      pGVar4 = Gia_ManStart(iVar1 * 10);
      p->pNew = pGVar4;
      Gia_ManIncrementTravId(p->pNew);
      Gia_ManHashAlloc(p->pNew);
      pGVar5 = Gia_ManConst0(p->pAig);
      pGVar5->Value = 0;
      clk._4_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->pAig->vCis);
        bVar7 = false;
        if (clk._4_4_ < iVar1) {
          _RetValue = Gia_ManCi(p->pAig,clk._4_4_);
          bVar7 = _RetValue != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        uVar2 = Gia_ManAppendCi(p->pNew);
        _RetValue->Value = uVar2;
        clk._4_4_ = clk._4_4_ + 1;
      }
    }
    clk._4_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p->pAig);
      bVar7 = false;
      if (clk._4_4_ < iVar1) {
        pGVar4 = p->pAig;
        iVar1 = Gia_ManPiNum(p->pAig);
        _RetValue = Gia_ManCi(pGVar4,iVar1 + clk._4_4_);
        bVar7 = _RetValue != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_StaHasValue0(pS,clk._4_4_);
      if (iVar1 == 0) {
        iVar1 = Gia_StaHasValue1(pS,clk._4_4_);
        if (iVar1 == 0) {
          pGVar4 = p->pNew;
          p_00 = p->pNew;
          iVar1 = Gia_ObjCioId(_RetValue);
          pGVar5 = Gia_ManCi(p_00,iVar1);
          iVar1 = Gia_ObjId(pGVar4,pGVar5);
          uVar2 = Abc_Var2Lit(iVar1,0);
          _RetValue->Value = uVar2;
        }
        else {
          _RetValue->Value = 1;
        }
      }
      else {
        _RetValue->Value = 0;
      }
      clk._4_4_ = clk._4_4_ + 1;
    }
    clk._4_4_ = 0;
    while( true ) {
      bVar7 = false;
      if (clk._4_4_ < p->pAig->nObjs) {
        _RetValue = Gia_ManObj(p->pAig,clk._4_4_);
        bVar7 = _RetValue != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(_RetValue);
      if (iVar1 != 0) {
        pGVar4 = p->pNew;
        iVar1 = Gia_ObjFanin0Copy(_RetValue);
        iLit1 = Gia_ObjFanin1Copy(_RetValue);
        uVar2 = Gia_ManHashAnd(pGVar4,iVar1,iLit1);
        _RetValue->Value = uVar2;
      }
      clk._4_4_ = clk._4_4_ + 1;
    }
    clk._4_4_ = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->pAig->vCos);
      bVar7 = false;
      if (clk._4_4_ < iVar1) {
        _RetValue = Gia_ManCo(p->pAig,clk._4_4_);
        bVar7 = _RetValue != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar2 = Gia_ObjFanin0Copy(_RetValue);
      _RetValue->Value = uVar2;
      clk._4_4_ = clk._4_4_ + 1;
    }
    p->nRecCalls = 0;
    p_local._4_4_ = Gia_ManAreDeriveNexts_rec(p,Sta);
    if (999999 < p->nRecCalls) {
      printf("Exceeded the limit on the number of transitions from a state cube (%d).\n",1000000);
      p->fStopped = 1;
    }
    aVar6 = Abc_Clock();
    p->timeAig = p->timeAig + ((int)aVar6 - (int)aVar3);
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManAreDeriveNexts( Gia_ManAre_t * p, Gia_PtrAre_t Sta )
{
    Gia_StaAre_t * pSta;
    Gia_Obj_t * pObj;
    int i, RetValue;
    abctime clk = Abc_Clock();
    pSta = Gia_ManAreSta( p, Sta );
    if ( Gia_StaIsUnused(pSta) )
        return 0;
    // recycle the manager
    if ( p->pNew && Gia_ManObjNum(p->pNew) > 1000000 )
    {
        Gia_ManStop( p->pNew );
        p->pNew = NULL;
    }
    // allocate the manager
    if ( p->pNew == NULL )
    {
        p->pNew = Gia_ManStart( 10 * Gia_ManObjNum(p->pAig) );
        Gia_ManIncrementTravId( p->pNew );
        Gia_ManHashAlloc( p->pNew );
        Gia_ManConst0(p->pAig)->Value = 0;
        Gia_ManForEachCi( p->pAig, pObj, i )
            pObj->Value = Gia_ManAppendCi(p->pNew);
    }
    Gia_ManForEachRo( p->pAig, pObj, i )
    {
        if ( Gia_StaHasValue0( pSta, i ) )
            pObj->Value = 0;
        else if ( Gia_StaHasValue1( pSta, i ) )
            pObj->Value = 1;
        else // don't-care literal
            pObj->Value = Abc_Var2Lit( Gia_ObjId( p->pNew, Gia_ManCi(p->pNew, Gia_ObjCioId(pObj)) ), 0 );
    }
    Gia_ManForEachAnd( p->pAig, pObj, i )
        pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p->pAig, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);

    // perform case-splitting
    p->nRecCalls = 0;
    RetValue = Gia_ManAreDeriveNexts_rec( p, Sta );
    if ( p->nRecCalls >= MAX_CALL_NUM )
    {
        printf( "Exceeded the limit on the number of transitions from a state cube (%d).\n", MAX_CALL_NUM );
        p->fStopped = 1;
    }
//    printf( "%d ", p->nRecCalls );
//printf( "%d ", Gia_ManObjNum(p->pNew) );
    p->timeAig += Abc_Clock() - clk;
    return RetValue;
}